

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

RTQuaternion __thiscall RTMatrix4x4::operator*(RTMatrix4x4 *this,RTQuaternion *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  RTFLOAT RVar5;
  RTFLOAT RVar6;
  RTFLOAT RVar7;
  RTFLOAT RVar8;
  RTQuaternion *q_local;
  RTMatrix4x4 *this_local;
  RTQuaternion res;
  
  RTQuaternion::RTQuaternion((RTQuaternion *)&this_local);
  fVar1 = this->m_data[0][0];
  RVar5 = RTQuaternion::scalar(q);
  fVar2 = this->m_data[0][1];
  RVar6 = RTQuaternion::x(q);
  fVar3 = this->m_data[0][2];
  RVar7 = RTQuaternion::y(q);
  fVar4 = this->m_data[0][3];
  RVar8 = RTQuaternion::z(q);
  RTQuaternion::setScalar
            ((RTQuaternion *)&this_local,
             fVar4 * RVar8 + fVar3 * RVar7 + fVar1 * RVar5 + fVar2 * RVar6);
  fVar1 = this->m_data[1][0];
  RVar5 = RTQuaternion::scalar(q);
  fVar2 = this->m_data[1][1];
  RVar6 = RTQuaternion::x(q);
  fVar3 = this->m_data[1][2];
  RVar7 = RTQuaternion::y(q);
  fVar4 = this->m_data[1][3];
  RVar8 = RTQuaternion::z(q);
  RTQuaternion::setX((RTQuaternion *)&this_local,
                     fVar4 * RVar8 + fVar3 * RVar7 + fVar1 * RVar5 + fVar2 * RVar6);
  fVar1 = this->m_data[2][0];
  RVar5 = RTQuaternion::scalar(q);
  fVar2 = this->m_data[2][1];
  RVar6 = RTQuaternion::x(q);
  fVar3 = this->m_data[2][2];
  RVar7 = RTQuaternion::y(q);
  fVar4 = this->m_data[2][3];
  RVar8 = RTQuaternion::z(q);
  RTQuaternion::setY((RTQuaternion *)&this_local,
                     fVar4 * RVar8 + fVar3 * RVar7 + fVar1 * RVar5 + fVar2 * RVar6);
  fVar1 = this->m_data[3][0];
  RVar5 = RTQuaternion::scalar(q);
  fVar2 = this->m_data[3][1];
  RVar6 = RTQuaternion::x(q);
  fVar3 = this->m_data[3][2];
  RVar7 = RTQuaternion::y(q);
  fVar4 = this->m_data[3][3];
  RVar8 = RTQuaternion::z(q);
  RTQuaternion::setZ((RTQuaternion *)&this_local,
                     fVar4 * RVar8 + fVar3 * RVar7 + fVar1 * RVar5 + fVar2 * RVar6);
  return (RTQuaternion)_this_local;
}

Assistant:

const RTQuaternion RTMatrix4x4::operator *(const RTQuaternion& q) const
{
    RTQuaternion res;

    res.setScalar(m_data[0][0] * q.scalar() + m_data[0][1] * q.x() + m_data[0][2] * q.y() + m_data[0][3] * q.z());
    res.setX(m_data[1][0] * q.scalar() + m_data[1][1] * q.x() + m_data[1][2] * q.y() + m_data[1][3] * q.z());
    res.setY(m_data[2][0] * q.scalar() + m_data[2][1] * q.x() + m_data[2][2] * q.y() + m_data[2][3] * q.z());
    res.setZ(m_data[3][0] * q.scalar() + m_data[3][1] * q.x() + m_data[3][2] * q.y() + m_data[3][3] * q.z());

    return res;
}